

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

size_t arith_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  pointer ibuff_00;
  size_t i;
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar5;
  ulong uVar6;
  uint32_t *osize_00;
  ulong uVar7;
  size_t i_1;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  size_t maxv;
  
  osize_00 = ibuff;
  count_freqs(&F,ibuff,isize,&maxv);
  ibuff_00 = F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar6 = 0;
  for (sVar1 = 0xffffffffffffffff; maxv != sVar1; sVar1 = sVar1 + 1) {
    uVar6 = (uVar6 + 1) -
            (ulong)(F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar1 + 1] == 0);
    F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[sVar1 + 1] =
         F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[sVar1 + 1] + 1;
  }
  sVar1 = byte_encode(obuff,(size_t)osize_00,maxv,0x80000000);
  sVar2 = byte_encode(obuff + sVar1,(size_t)osize_00,uVar6,0x80000000);
  lVar3 = sVar2 + sVar1;
  if (uVar6 < 1000) {
    sVar1 = interp_compress(obuff + lVar3,osize - lVar3,ibuff_00,maxv + 1);
    iVar5 = extraout_EDX;
  }
  else {
    sVar1 = arith_compress(obuff + lVar3,osize - lVar3,ibuff_00,maxv + 1);
    iVar5 = extraout_EDX_00;
  }
  scale_counts(&F,maxv,iVar5);
  *F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
   ._M_start = 0;
  for (uVar6 = 1; uVar6 <= maxv; uVar6 = uVar6 + 1) {
    F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] =
         F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6] +
         F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6 - 1];
  }
  sVar1 = sVar1 + lVar3;
  bVar10 = true;
  uVar7 = 0;
  iVar5 = 0;
  uVar6 = 0xffffffffffffff;
  uVar4 = 0;
  for (sVar2 = 0; sVar2 != isize; sVar2 = sVar2 + 1) {
    uVar8 = uVar6 >> 0x1f;
    lVar3 = uVar8 * F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[ibuff[sVar2]];
    uVar4 = uVar4 + lVar3;
    uVar6 = uVar6 - lVar3;
    if (-1 < (int)F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[ibuff[sVar2] + 1]) {
      uVar6 = ((ulong)F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[ibuff[sVar2] + 1] -
              (ulong)F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[ibuff[sVar2]]) * uVar8;
    }
    if (0xffffffffffffff < uVar4) {
      uVar7 = (ulong)(byte)((uint8_t)uVar7 + 1);
      while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
        obuff[sVar1] = (uint8_t)uVar7;
        sVar1 = sVar1 + 1;
        uVar7 = 0;
      }
      uVar4 = uVar4 & 0xffffffffffffff;
      iVar5 = 0;
    }
    for (; uVar6 >> 0x30 == 0; uVar6 = uVar6 << 8) {
      if ((~uVar4 & 0xff000000000000) == 0) {
        iVar5 = iVar5 + 1;
      }
      else {
        if (!bVar10) {
          obuff[sVar1] = (uint8_t)uVar7;
          sVar1 = sVar1 + 1;
        }
        uVar7 = uVar4 >> 0x30;
        while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
          obuff[sVar1] = 0xff;
          sVar1 = sVar1 + 1;
        }
        iVar5 = 0;
        bVar10 = false;
      }
      uVar4 = (uVar4 & 0xffffffffffff) << 8;
    }
  }
  if (bVar10) goto LAB_0013cc5d;
  obuff[sVar1] = (uint8_t)uVar7;
  while( true ) {
    sVar1 = sVar1 + 1;
LAB_0013cc5d:
    bVar10 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar10) break;
    obuff[sVar1] = 0xff;
  }
  uVar6 = 0x30;
  for (iVar5 = 6; -1 < iVar5; iVar5 = iVar5 + -1) {
    uVar7 = uVar6 & 0x3f;
    uVar6 = (ulong)((int)uVar6 - 8);
    obuff[sVar1] = (uint8_t)(uVar4 >> uVar7);
    sVar1 = sVar1 + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return sVar1;
}

Assistant:

size_t arith_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    /* returns the number of bytes written to the output buffer,
           fails/exits if output buffer is too small, provided that
           //myassertion() in enabled */

    /* state variables for encoding */
    uint64_t L = ZERO;
    uint64_t R = FULL;
    uint64_t low, high, total, scale;
    uint32_t v;
    uint8_t last_non_ff_byte = 0, byte;
    uint32_t num_ff_bytes = 0;

    int first = 1;
    size_t op = 0;
    size_t maxv, nunq = 0;

    /* count the frequencies of the provided symbols */
    auto F = count_freqs(ibuff, isize, &maxv);

    /* adjust the counts to allow the interpolative encoder to work */
    for (size_t i = 0; i <= maxv; i++) {
        nunq += (F[i] > 0);
        F[i]++;
    }

    /* now code the prelude into the output buffer */
    op += byte_encode(obuff + op, osize - op, maxv, (1LL << 31));
    op += byte_encode(obuff + op, osize - op, nunq, (1LL << 31));

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        op += interp_compress(obuff + op, osize - op, F.data(), maxv + 1);
    } else {
        /* or else, ta-daa, recursive call for prelude... */
        op += arith_compress(obuff + op, osize - op, F.data(), maxv + 1);
    }

    /* and now scale them up to get total to be a power of two */
    total = scale_counts(F, maxv, 0);

    /* bit ugly to have this next output line coming from here,
           but will do for now */
    /* and turn the adjusted counts in F into cumulative array */
    F[0] = 0;
    for (size_t i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* now encode the array of symbols using the fixed array F to
           control probability estimation, one at a time */
    for (size_t i = 0; i < isize; i++) {
        v = ibuff[i] + 1;

        /* allocated probability range for this symbol */
        low = F[v - 1];
        high = F[v];

        /* this is the actual arithmetic coding step */
        scale = R >> TBTS;
        L += low * scale;
        if (high < total) {
            /* top symbol gets beneit of rounding gaps */
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        /* now sort out the carry/renormalization process */
        if (L > FULL) {
            /* lower bound has overflowed, need first to push
                           a carry through the ff bytes and into the pending
                           non-ff byte */
            last_non_ff_byte += 1;
            L &= FULL;
            while (num_ff_bytes > 0) {
                obuff[op++] = last_non_ff_byte;
                num_ff_bytes--;
                last_non_ff_byte = ZERO;
            }
        }

        /* more normal type of renorm step */
        while (R < PART) {
            /* can output (or rather, save for later output)
                           a byte from the front of L */
            byte = (L >> (BBITS - 8));
            if (byte != FULLBYTE) {
                /* not ff, so can bring everything up to date */
                if (!first) {
                    obuff[op++] = last_non_ff_byte;
                }
                while (num_ff_bytes) {
                    obuff[op++] = FULLBYTE;
                    num_ff_bytes--;
                }
                last_non_ff_byte = byte;
                first = 0;
            } else {
                /* ff bytes just get counted */
                num_ff_bytes++;
            }
            L <<= 8;
            L &= FULL;
            R <<= 8;
        }
    }

    /* wind up: first flush all of the pending bytes */
    if (!first) {
        obuff[op++] = last_non_ff_byte;
    }
    while (num_ff_bytes) {
        obuff[op++] = FULLBYTE;
        num_ff_bytes--;
    }

    /* then send the final bytes from L, to be sure to be sure */
    for (int i = BBYTES - 1; i >= 0; i--) {
        obuff[op++] = (L >> ((8 * i))) & FULLBYTE;
    }

    /* tidy up, and done */
    return op;
}